

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

ScenarioUpperBound * __thiscall
despot::POMDPX::CreateScenarioUpperBound(POMDPX *this,string *name,string *particle_bound_name)

{
  StateIndexer *indexer_00;
  bool bVar1;
  int iVar2;
  POMDPX *pPVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  string local_60 [32];
  StateIndexer *local_40;
  StateIndexer *indexer;
  string *local_28;
  string *particle_bound_name_local;
  string *name_local;
  POMDPX *this_local;
  
  local_28 = particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  if ((this->is_small_ & 1U) == 0) {
    pPVar3 = (POMDPX *)operator_new(0x10);
    TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)pPVar3,&this->super_DSPOMDP);
    this_local = pPVar3;
  }
  else {
    local_40 = &this->super_StateIndexer;
    bVar1 = std::operator==(name,"TRIVIAL");
    if (bVar1) {
      pPVar3 = (POMDPX *)operator_new(0x10);
      TrivialParticleUpperBound::TrivialParticleUpperBound
                ((TrivialParticleUpperBound *)pPVar3,&this->super_DSPOMDP);
      this_local = pPVar3;
    }
    else {
      bVar1 = std::operator==(name,"MDP");
      if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
        bVar1 = std::operator==(name,"LOOKAHEAD");
        if (bVar1) {
          pPVar3 = (POMDPX *)operator_new(0x38);
          indexer_00 = local_40;
          std::__cxx11::string::string(local_60,(string *)particle_bound_name);
          iVar2 = (*(this->super_MDP)._vptr_MDP[0x11])(this,local_60);
          LookaheadUpperBound::LookaheadUpperBound
                    ((LookaheadUpperBound *)pPVar3,&this->super_DSPOMDP,indexer_00,
                     (ParticleUpperBound *)CONCAT44(extraout_var,iVar2));
          this_local = pPVar3;
          std::__cxx11::string::~string(local_60);
          return (ScenarioUpperBound *)this_local;
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
        poVar4 = std::operator<<(poVar4,(string *)name);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      pPVar3 = (POMDPX *)operator_new(0x38);
      MDPUpperBound::MDPUpperBound
                ((MDPUpperBound *)pPVar3,&this->super_MDP,&this->super_StateIndexer);
      this_local = pPVar3;
    }
  }
  return (ScenarioUpperBound *)this_local;
}

Assistant:

ScenarioUpperBound* POMDPX::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *indexer,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}